

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

char * CreateLlvmName(LlvmCompilationContext *ctx,InplaceStr str)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  char *__dest;
  
  uVar2 = (long)str.end - (long)str.begin;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)((int)uVar2 + 1));
  __dest = (char *)CONCAT44(extraout_var,iVar1);
  uVar2 = uVar2 & 0xffffffff;
  memcpy(__dest,str.begin,uVar2);
  __dest[uVar2] = '\0';
  return __dest;
}

Assistant:

char* CreateLlvmName(LlvmCompilationContext &ctx, InplaceStr str)
{
	char *name = (char*)ctx.allocator->alloc(str.length() + 1);

	memcpy(name, str.begin, str.length());
	name[str.length()] = 0;

	return name;
}